

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O3

int NULLCTypeInfo::MemberCount(int *type)

{
  uint *puVar1;
  uint uVar2;
  char *__function;
  uint uVar3;
  long lVar4;
  
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0x11,"int NULLCTypeInfo::MemberCount(int *)");
  }
  if ((uint)*type < *(uint *)(linker + 0x20c)) {
    lVar4 = (ulong)(uint)*type * 0x50;
    puVar1 = (uint *)(*(long *)(linker + 0x200) + lVar4);
    if (*(int *)(*(long *)(linker + 0x200) + 0x10 + lVar4) == 4) {
      uVar3 = puVar1[6];
    }
    else {
      uVar2 = *puVar1;
      if (*(uint *)(linker + 0x29c) <= uVar2) {
        __function = 
        "T &FastVector<char>::operator[](unsigned int) [T = char, zeroNewMemory = false, skipConstructor = false]"
        ;
        goto LAB_00121975;
      }
      uVar3 = 0;
      nullcThrowError("typeid::memberCount: type (%s) is not a class",
                      (ulong)uVar2 + *(long *)(linker + 0x290));
    }
    return uVar3;
  }
  __function = 
  "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
  ;
LAB_00121975:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/../Array.h"
                ,0x7f,__function);
}

Assistant:

int MemberCount(int* type)
	{
		assert(linker);
		ExternTypeInfo &exType = linker->exTypes[*type];
		if(exType.subCat != ExternTypeInfo::CAT_CLASS)
		{
			nullcThrowError("typeid::memberCount: type (%s) is not a class", &linker->exSymbols[exType.offsetToName]);
			return 0;
		}
		return exType.memberCount;
	}